

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c97ca::AssertionEmitter::emitFunction(AssertionEmitter *this,Ref func)

{
  ostream *poVar1;
  undefined1 local_50 [8];
  JSPrinter jser;
  
  local_50[0] = true;
  local_50[1] = true;
  jser.pretty = false;
  jser.finalize = false;
  jser._2_6_ = 0;
  jser.buffer._0_5_ = 0;
  jser.buffer._5_3_ = 0;
  jser.size._0_5_ = 0;
  jser.size._5_3_ = 0;
  jser.used._0_5_ = 0;
  jser._32_8_ = func.inst;
  cashew::JSPrinter::print((JSPrinter *)local_50,func);
  cashew::JSPrinter::ensure((JSPrinter *)local_50,1);
  *(undefined1 *)(jser._0_8_ + CONCAT35(jser.size._5_3_,(undefined5)jser.size)) = 0;
  poVar1 = ::wasm::Output::operator<<(this->out,(char **)&jser);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  free((void *)jser._0_8_);
  return;
}

Assistant:

void emitFunction(Ref func) {
    JSPrinter jser(true, true, func);
    jser.printAst();
    out << jser.buffer << std::endl;
  }